

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

void generateNewTree(int ntaxa,bool rerootTrees,bool pectinate,bool postorderTraversal,
                    bool dynamicScaling,int edgeCount,int internalCount,int unpartOpsCount,
                    int partitionCount,int beagleOpCount,int *operations)

{
  node *pnVar1;
  _Map_pointer pppnVar2;
  node *pnVar3;
  node *root;
  _Elt_pointer ppnVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int j;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int local_108;
  int local_f8;
  vector<node_*,_std::allocator<node_*>_> nodes;
  int *local_d0;
  node *newTip;
  deque<node_*,_std::allocator<node_*>_> S;
  _Vector_base<node_*,_std::allocator<node_*>_> local_60;
  _Vector_base<node_*,_std::allocator<node_*>_> local_48;
  
  nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)createNewNode(0);
  std::vector<node*,std::allocator<node*>>::emplace_back<node*>
            ((vector<node*,std::allocator<node*>> *)&nodes,(node **)&S);
  pppnVar2 = (_Map_pointer)operations;
  iVar11 = ntaxa;
  for (iVar12 = 1; iVar12 < ntaxa; iVar12 = iVar12 + 1) {
    if (pectinate) {
      iVar13 = (int)((long)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) + -1;
    }
    else {
      iVar13 = gt_rand();
      iVar13 = (int)((ulong)(long)iVar13 %
                    (ulong)((long)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3));
    }
    newTip = createNewNode(iVar12);
    S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)createNewNode(iVar11);
    std::vector<node_*,_std::allocator<node_*>_>::push_back(&nodes,&newTip);
    std::vector<node_*,_std::allocator<node_*>_>::push_back(&nodes,(value_type *)&S);
    S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map[2] =
         (node **)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar13];
    S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map[3] =
         (node **)newTip;
    if (nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar13]->parent != (node *)0x0) {
      S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map[4]
           = (node **)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar13]->parent;
      pnVar3 = nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar13]->parent;
      (&pnVar3->left)
      [pnVar3->left !=
       nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar13]] =
           (node *)S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.
                   super__Deque_impl_data._M_map;
    }
    iVar11 = iVar11 + 1;
    nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar13]->parent =
         (node *)S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data
                 ._M_map;
    newTip->parent =
         (node *)S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data
                 ._M_map;
    pppnVar2 = S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
               _M_map;
  }
  pnVar3 = *nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    root = pnVar3;
    pnVar3 = root->parent;
  } while (root->parent != (node *)0x0);
  iVar12 = *(int *)pppnVar2;
  *(int *)pppnVar2 = root->data;
  root->data = iVar12;
  if (rerootTrees) {
    local_f8 = countLaunches(root,postorderTraversal);
    S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_start.
    _M_cur = (_Elt_pointer)0x0;
    S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)0x0;
    S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data._M_map_size
         = 0;
    local_108 = -1;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      pnVar3 = nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
      pnVar1 = pnVar3->parent;
      if (pnVar1 != root && pnVar1 != (node *)0x0) {
        std::vector<node_*,_std::allocator<node_*>_>::vector
                  ((vector<node_*,_std::allocator<node_*>_> *)&local_48,
                   (vector<node_*,_std::allocator<node_*>_> *)&S);
        pnVar3 = reroot(pnVar3,root,(vector<node_*,_std::allocator<node_*>_> *)&local_48);
        std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base(&local_48);
        iVar12 = countLaunches(pnVar3,postorderTraversal);
        if ((_Map_pointer)
            S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
            _M_map_size !=
            S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
            _M_map) {
          S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
          _M_map_size = (size_t)S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.
                                super__Deque_impl_data._M_map;
        }
        if (iVar12 < local_f8) {
          local_108 = (int)uVar5;
          local_f8 = iVar12;
        }
      }
    }
    if (local_108 != -1) {
      pnVar3 = nodes.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_108];
      std::vector<node_*,_std::allocator<node_*>_>::vector
                ((vector<node_*,_std::allocator<node_*>_> *)&local_60,
                 (vector<node_*,_std::allocator<node_*>_> *)&S);
      root = reroot(pnVar3,root,(vector<node_*,_std::allocator<node_*>_> *)&local_60);
      std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base(&local_60);
    }
    std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base
              ((_Vector_base<node_*,_std::allocator<node_*>_> *)&S);
  }
  std::_Deque_base<node_*,_std::allocator<node_*>_>::_Deque_base
            (&S.super__Deque_base<node_*,_std::allocator<node_*>_>);
  if (postorderTraversal) {
    traversePostorder(root,&S);
  }
  else {
    reverseLevelOrder(root,&S);
  }
  if (!dynamicScaling) {
    internalCount = -1;
  }
  local_d0 = operations + 8;
  for (uVar5 = 0; uVar5 != (uint)(~(unpartOpsCount >> 0x1f) & unpartOpsCount); uVar5 = uVar5 + 1) {
    ppnVar4 = S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_cur;
    if (S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      ppnVar4 = S.super__Deque_base<node_*,_std::allocator<node_*>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node[-1] + 0x40;
    }
    pnVar3 = ppnVar4[-1];
    std::deque<node_*,_std::allocator<node_*>_>::pop_back(&S);
    iVar12 = pnVar3->data;
    iVar11 = pnVar3->left->data;
    iVar13 = pnVar3->right->data;
    iVar6 = -1;
    if (dynamicScaling) {
      iVar6 = iVar12;
    }
    piVar9 = local_d0;
    iVar7 = iVar11;
    iVar8 = iVar13;
    for (uVar10 = 0; (uint)(~(partitionCount >> 0x1f) & partitionCount) != uVar10;
        uVar10 = uVar10 + 1) {
      piVar9[-8] = iVar12;
      piVar9[-7] = iVar6;
      piVar9[-6] = iVar6;
      piVar9[-5] = iVar11;
      piVar9[-4] = iVar7;
      piVar9[-3] = iVar13;
      piVar9[-2] = iVar8;
      if (1 < partitionCount) {
        piVar9[-1] = (int)uVar10;
        *piVar9 = internalCount;
      }
      piVar9 = piVar9 + beagleOpCount;
      iVar8 = iVar8 + edgeCount;
      iVar7 = iVar7 + edgeCount;
    }
    local_d0 = local_d0 + (long)partitionCount * (long)beagleOpCount;
  }
  std::_Deque_base<node_*,_std::allocator<node_*>_>::~_Deque_base
            (&S.super__Deque_base<node_*,_std::allocator<node_*>_>);
  std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base
            (&nodes.super__Vector_base<node_*,_std::allocator<node_*>_>);
  return;
}

Assistant:

void generateNewTree(int ntaxa,
                    bool rerootTrees,
                    bool pectinate,
                    bool postorderTraversal,
                    bool dynamicScaling,
                    int edgeCount,
                    int internalCount,
                    int unpartOpsCount,
                    int partitionCount,
                    int beagleOpCount,
#ifdef HAVE_PLL
                    bool pllTest,
                    pll_operation_t* pll_operations,
#endif
#ifdef HAVE_NCL
                    char* treenewick,
#endif 
                    int* operations)
{
    std::vector <node*> nodes;
    node* root = NULL;


    bool useNewickTree = false;

#ifdef HAVE_NCL
    useNewickTree = treenewick;
#endif 

    if (!useNewickTree)
    {
        nodes.push_back(createNewNode(0));
        int tipsAdded = 1;
        node* newParent;
        while (tipsAdded < ntaxa) {
            int sibling;
            if (pectinate)
                sibling = nodes.size()-1;
            else
                sibling = gt_rand() % nodes.size();
            node* newTip = createNewNode(tipsAdded);
            newParent = createNewNode(ntaxa + tipsAdded - 1);
            nodes.push_back(newTip);
            nodes.push_back(newParent);
            tipsAdded++;            
            newParent->left  = nodes[sibling];
            newParent->right = newTip;            
            if (nodes[sibling]->parent != NULL) {
                newParent->parent = nodes[sibling]->parent;
                if (nodes[sibling]->parent->left == nodes[sibling]) {
                    nodes[sibling]->parent->left = newParent;
                } else {
                    nodes[sibling]->parent->right = newParent;
                }
            }
            nodes[sibling]->parent = newParent;
            newTip->parent         = newParent;
        }
        root = nodes[0];
        while(root->parent != NULL) {
            root = root->parent;
        }
        int rootIndex = newParent->data;
        newParent->data = root->data;
        root->data = rootIndex;
    } else {
        root = createNewNode(0);
#ifdef HAVE_NCL
        ncl_generateTreeFromNewick(treenewick, ntaxa, nodes, root);
#endif 
    }

    if (rerootTrees) {
        int bestRerootNode = -1;
        int bestLaunchCount = countLaunches(root, postorderTraversal);

        // printf("\nroot node   = %d\tparallel launches = %d\n", root->data, bestLaunchCount);


        std::vector<node*> newNodes;

        for(int i = 0; i < nodes.size(); i++) {

            // printf("reroot node = %02d\t", nodes[i]->data);

            node* rerootNode = nodes[i];

            if (rerootNode->parent != NULL && rerootNode->parent != root) {
                
                node* newRoot = reroot(rerootNode, root, newNodes);

                int launchCount = countLaunches(newRoot, postorderTraversal);

                newNodes.clear();

                // printf("parallel launches = %d\n", launchCount);

                if (launchCount < bestLaunchCount) {
                    bestLaunchCount = launchCount;
                    bestRerootNode = i;
                }

            }
            // else {printf("doesn't change tree\n");}

        }

        if (bestRerootNode != -1) {
            // printf("\nbestLaunchCount = %d, node index = %d\n\n", bestLaunchCount, bestRerootNode);
            node* rerootNode = nodes[bestRerootNode];
            node* oldRoot = root;
            root = reroot(rerootNode, oldRoot, newNodes);
        }

    } 

    std::deque <node *> S;
    if (postorderTraversal == true) {
        traversePostorder(root, S);
    } else {
        reverseLevelOrder(root, S);
    }

    // while (S.empty() == false) {
    //     node* tmpNode = S.back();
    //     std::cout << tmpNode->data << " ";
    //     S.pop_back();
    // }
    // std::cout << std::endl;
    // reverseLevelOrder(root, S);

    // struct node *root = createNewNode(4);
    // root->left        = createNewNode(0);
    // root->right       = createNewNode(6);
    // root->right->left  = createNewNode(5);
    // root->right->right = createNewNode(3);
    // root->right->left->left  = createNewNode(1);
    // root->right->left->right = createNewNode(2);
    // std::deque <node *> S;
    // reverseLevelOrder(root, S);

    // printf("launch count = %03d", countLaunches(root));

    for(int op=0; op<unpartOpsCount; op++){
        node* parent = S.back();
        S.pop_back();
        int parentIndex = parent->data;
        int child1Index = parent->left->data;
        int child2Index = parent->right->data;

        for (int j=0; j<partitionCount; j++) {
            int opJ = partitionCount*op + j;
            operations[opJ*beagleOpCount+0] = parentIndex;
            operations[opJ*beagleOpCount+1] = (dynamicScaling ? parentIndex : BEAGLE_OP_NONE);
            operations[opJ*beagleOpCount+2] = (dynamicScaling ? parentIndex : BEAGLE_OP_NONE);
            operations[opJ*beagleOpCount+3] = child1Index;
            operations[opJ*beagleOpCount+4] = child1Index + j*edgeCount;;
            operations[opJ*beagleOpCount+5] = child2Index;
            operations[opJ*beagleOpCount+6] = child2Index + j*edgeCount;
            if (partitionCount > 1) {
                operations[opJ*beagleOpCount+7] = j;
                operations[opJ*beagleOpCount+8] = (dynamicScaling ? internalCount : BEAGLE_OP_NONE);
            }

    #ifdef HAVE_PLL
            if (pllTest) {
                pll_operations[op].parent_clv_index    = parentIndex;
                pll_operations[op].child1_clv_index    = child1Index;
                pll_operations[op].child2_clv_index    = child2Index;
                pll_operations[op].child1_matrix_index = child1Index + j*edgeCount;
                pll_operations[op].child2_matrix_index = child2Index + j*edgeCount;
                pll_operations[op].parent_scaler_index = PLL_SCALE_BUFFER_NONE;
                pll_operations[op].child1_scaler_index = PLL_SCALE_BUFFER_NONE;
                pll_operations[op].child2_scaler_index = PLL_SCALE_BUFFER_NONE;
            }
    #endif // HAVE_PLL

        // printf("op %02d part %02d dest %02d c1 %02d c2 %02d\n",
               // opJ, j, parentIndex, child1Index, child2Index);
        }
        // printf("\n");
    }   

}